

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QSpanCollection::updateRemovedRows(QSpanCollection *this,int start,int end)

{
  size_t *psVar1;
  Index *this_00;
  _List_node_base *p_Var2;
  undefined8 *******pppppppuVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  _List_node_base *p_Var7;
  const_iterator afirst;
  iterator iVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  const_iterator cVar12;
  SubIndex *this_01;
  undefined8 *******pppppppuVar13;
  int iVar14;
  int iVar15;
  QSpanCollection *pQVar16;
  QSpanCollection *pQVar17;
  long in_FS_OFFSET;
  Span *span_1;
  Span *span;
  int local_64;
  QMap<int,_QSpanCollection::Span_*> local_60;
  QMap<int,_QSpanCollection::Span_*> local_58;
  undefined8 *******local_50;
  undefined8 *******local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar16 = (QSpanCollection *)
            (this->spans).
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar16 != this) {
    local_40 = 0;
    iVar6 = (end - start) + 1;
    local_50 = &local_50;
    local_48 = &local_50;
    do {
      p_Var2 = (_List_node_base *)
               (pQVar16->spans).
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node._M_size;
      iVar14 = *(int *)&p_Var2->_M_prev;
      if (iVar14 < start) {
LAB_005829e0:
        pQVar17 = (QSpanCollection *)
                  (pQVar16->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
      }
      else {
        iVar15 = *(int *)&p_Var2->_M_next;
        if (iVar15 < start) {
          if (end < iVar14) {
            *(int *)&p_Var2->_M_prev = iVar14 - iVar6;
            iVar14 = iVar14 - iVar6;
          }
          else {
            *(int *)&p_Var2->_M_prev = start + -1;
            iVar14 = start + -1;
          }
        }
        else if (end < iVar14) {
          bVar5 = iVar15 <= end;
          iVar15 = iVar15 - iVar6;
          if (bVar5) {
            iVar15 = start;
          }
          *(int *)&p_Var2->_M_next = iVar15;
          iVar14 = iVar14 - iVar6;
          *(int *)&p_Var2->_M_prev = iVar14;
        }
        else {
          *(undefined1 *)&p_Var2[1]._M_next = 1;
        }
        if ((iVar15 == iVar14) &&
           (*(int *)((long)&p_Var2->_M_next + 4) == *(int *)((long)&p_Var2->_M_prev + 4))) {
          *(undefined1 *)&p_Var2[1]._M_next = 1;
        }
        if (*(char *)&p_Var2[1]._M_next != '\x01') goto LAB_005829e0;
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = p_Var2;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        local_40 = local_40 + 1;
        pQVar17 = (QSpanCollection *)
                  (pQVar16->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        psVar1 = &(this->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pQVar16,0x18);
      }
      pQVar16 = pQVar17;
    } while (pQVar17 != this);
    pppppppuVar13 = local_50;
    if ((QSpanCollection *)
        (this->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == this) {
      for (; (undefined8 ********)pppppppuVar13 != &local_50;
          pppppppuVar13 = (undefined8 *******)*pppppppuVar13) {
        operator_delete(pppppppuVar13[2],0x14);
      }
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
    }
    else {
      this_00 = &this->index;
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
      cVar12._M_node = &(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      do {
        afirst._M_node = (_Base_ptr)std::_Rb_tree_decrement(cVar12._M_node);
        iVar14 = -*(int *)((long)afirst._M_node + 0x20);
        this_01 = (SubIndex *)((long)afirst._M_node + 0x28);
        if (iVar14 < start) {
          bVar5 = cleanSpanSubIndex((QSpanCollection *)cVar12._M_node,this_01,iVar14,false);
          if (bVar5) {
LAB_00582c12:
            cVar10.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
            afirst._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           (this_00,(const_iterator)afirst._M_node,cVar10);
          }
        }
        else {
          if (end < iVar14) {
            iVar15 = *(int *)((long)afirst._M_node + 0x20) + iVar6;
            if (end + 1 == iVar14) {
              local_58.d.d.ptr._0_4_ = iVar15;
              iVar8._M_node =
                   (_Base_ptr)
                   QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find(this_00,(int *)&local_58);
              QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
              if ((_Rb_tree_header *)iVar8._M_node ==
                  &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                local_60.d.d.ptr._0_4_ = iVar15;
                local_58.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                      )(totally_ordered_wrapper<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_*>
                        )0x0;
                iVar8._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                               (this_00,(int *)&local_60,&local_58);
                QtPrivate::
                QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                ::~QExplicitlySharedDataPointerV2(&local_58.d);
              }
              QMap<int,_QSpanCollection::Span_*>::detach(this_01);
              p_Var9 = *(_Base_ptr *)
                        ((long)&(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                                _M_header + 0x10);
              QMap<int,_QSpanCollection::Span_*>::detach(this_01);
              if ((_Rb_tree_header *)p_Var9 !=
                  &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                do {
                  local_58.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                        )p_Var9[1]._M_parent;
                  if (*(char *)&(((_Rb_tree_header *)((long)local_58.d.d.ptr + 0x10))->_M_header).
                                _M_color == '\0') {
                    QMap<int,_QSpanCollection::Span_*>::insert
                              ((QMap<int,_QSpanCollection::Span_*> *)&iVar8._M_node[1]._M_parent,
                               (int *)(p_Var9 + 1),(Span **)&local_58);
                  }
                  p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
                  QMap<int,_QSpanCollection::Span_*>::detach(this_01);
                } while ((_Rb_tree_header *)p_Var9 !=
                         &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
              }
            }
            else {
              local_58.d.d.ptr._0_4_ = iVar15;
              QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                        (this_00,(int *)&local_58,this_01);
            }
            goto LAB_00582c12;
          }
          local_58.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                )(totally_ordered_wrapper<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_*>
                  )0x0;
          QMap<int,_QSpanCollection::Span_*>::detach(this_01);
          p_Var9 = *(_Base_ptr *)
                    ((long)&(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                    0x10);
          QMap<int,_QSpanCollection::Span_*>::detach(this_01);
          if ((_Rb_tree_header *)p_Var9 ==
              &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
            bVar5 = false;
LAB_00582c45:
            cVar10.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
            afirst._M_node =
                 (_Base_ptr)
                 QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase
                           (this_00,(const_iterator)afirst._M_node,cVar10);
            if (bVar5) {
              cVar12._M_node = afirst._M_node;
              if (iVar14 != start) {
                local_60.d.d.ptr._0_4_ = -start;
                cVar12._M_node =
                     (_Base_ptr)
                     QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find(this_00,(int *)&local_60);
                QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
                if ((_Rb_tree_header *)cVar12._M_node ==
                    &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
                  local_60.d.d.ptr =
                       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                        )(totally_ordered_wrapper<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_*>
                          )0x0;
                  local_64 = -start;
                  cVar12._M_node =
                       (_Base_ptr)
                       QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::insert
                                 (this_00,&local_64,&local_60);
                  QtPrivate::
                  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                  ::~QExplicitlySharedDataPointerV2(&local_60.d);
                }
              }
              goto LAB_00582c73;
            }
          }
          else {
            bVar4 = false;
            do {
              local_60.d.d.ptr =
                   (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
                    )p_Var9[1]._M_parent;
              if (*(char *)&(((_Rb_tree_header *)((long)local_60.d.d.ptr + 0x10))->_M_header).
                            _M_color == '\0') {
                if ((!bVar4) && (*(int *)local_60.d.d.ptr == start)) {
                  bVar4 = true;
                }
                QMap<int,_QSpanCollection::Span_*>::insert
                          (&local_58,(int *)(p_Var9 + 1),(Span **)&local_60);
              }
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
              QMap<int,_QSpanCollection::Span_*>::detach(this_01);
            } while ((_Rb_tree_header *)p_Var9 !=
                     &(((this_01->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header);
            bVar5 = (bool)(iVar14 != start & bVar4);
            if ((iVar14 != start) || (!bVar4)) goto LAB_00582c45;
            QMap<int,_QSpanCollection::Span_*>::clear(this_01);
            cVar12._M_node = afirst._M_node;
LAB_00582c73:
            QMap<int,_QSpanCollection::Span_*>::detach(&local_58);
            p_Var11 = *(_Rb_tree_node_base **)((long)local_58.d.d.ptr + 0x20);
            QMap<int,_QSpanCollection::Span_*>::detach(&local_58);
            if (p_Var11 != (_Rb_tree_node_base *)((long)local_58.d.d.ptr + 0x10)) {
              do {
                QMap<int,_QSpanCollection::Span_*>::insert
                          ((QMap<int,_QSpanCollection::Span_*> *)&cVar12._M_node[1]._M_parent,
                           (int *)(p_Var11 + 1),(Span **)&p_Var11[1]._M_parent);
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                QMap<int,_QSpanCollection::Span_*>::detach(&local_58);
              } while (p_Var11 != (_Rb_tree_node_base *)((long)local_58.d.d.ptr + 0x10));
            }
          }
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2(&local_58.d);
        }
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
        pppppppuVar13 = local_50;
        cVar12._M_node = afirst._M_node;
      } while (afirst._M_node !=
               *(_Base_ptr *)
                ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header +
                0x10));
      for (; (undefined8 ********)pppppppuVar13 != &local_50;
          pppppppuVar13 = (undefined8 *******)*pppppppuVar13) {
        operator_delete(pppppppuVar13[2],0x14);
      }
    }
    pppppppuVar13 = local_50;
    while ((undefined8 ********)pppppppuVar13 != &local_50) {
      pppppppuVar3 = (undefined8 *******)*pppppppuVar13;
      operator_delete(pppppppuVar13,0x18);
      pppppppuVar13 = pppppppuVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateRemovedRows(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList spansToBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_bottom < start) {
            ++it;
            continue;
        }
        if (span->m_top < start) {
            if (span->m_bottom <= end)
                span->m_bottom = start - 1;
            else
                span->m_bottom -= delta;
        } else {
            if (span->m_bottom > end) {
                if (span->m_top <= end)
                    span->m_top = start;
                else
                    span->m_top -= delta;
                span->m_bottom -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            spansToBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(spansToBeDeleted);
        index.clear();
        return;
    }

    Index::iterator it_y = index.end();
    do {
        --it_y;
        int y = -it_y.key();
        SubIndex &subindex = it_y.value();
        if (y < start) {
            if (cleanSpanSubIndex(subindex, y))
                it_y = index.erase(it_y);
        } else if (y >= start && y <= end) {
            bool span_at_start = false;
            SubIndex spansToBeMoved;
            for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ++it) {
                Span *span = it.value();
                if (span->will_be_deleted)
                    continue;
                if (!span_at_start && span->m_top == start)
                    span_at_start = true;
                spansToBeMoved.insert(it.key(), span);
            }

            if (y == start && span_at_start)
                subindex.clear();
            else
                it_y = index.erase(it_y);

            if (span_at_start) {
                Index::iterator it_start;
                if (y == start)
                    it_start = it_y;
                else {
                    it_start = index.find(-start);
                    if (it_start == index.end())
                        it_start = index.insert(-start, SubIndex());
                }
                SubIndex &start_subindex = it_start.value();
                for (SubIndex::iterator it = spansToBeMoved.begin(); it != spansToBeMoved.end(); ++it)
                    start_subindex.insert(it.key(), it.value());
            }
        } else {
            if (y == end + 1) {
                Index::iterator it_top = index.find(-y + delta);
                if (it_top == index.end())
                    it_top = index.insert(-y + delta, SubIndex());
                for (SubIndex::iterator it = subindex.begin(); it != subindex.end(); ) {
                    Span *span = it.value();
                    if (!span->will_be_deleted)
                        it_top.value().insert(it.key(), span);
                    ++it;
                }
            } else {
                index.insert(-y + delta, subindex);
            }
            it_y = index.erase(it_y);
        }
    } while (it_y != index.begin());

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << spansToBeDeleted;
#endif
    qDeleteAll(spansToBeDeleted);
}